

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O0

void locatePath(char **path,uint *pathLength,char *relPath,uint relPathLength,char *systemDir,
               uint systemDirLength,void *symbol)

{
  uint uVar1;
  char *__src;
  uchar uVar2;
  uint local_dc;
  uint local_d8;
  uint length_1;
  char *dir_1;
  byte local_be;
  byte local_bd;
  uint systemBasePathLength;
  uchar relDirLength;
  uchar j;
  char *pcStack_b8;
  uint length;
  char *dir;
  uint local_a8;
  uint uStack_a4;
  uchar i;
  uint resultdirLength;
  uint subdirLength;
  char *subdir;
  uint local_90;
  uint lengths [3];
  char *dirs [3];
  uint local_68;
  uint maxLength;
  uint libraryPathDirectoryLength;
  uint libraryPathLength;
  char *libraryPath;
  char *pcStack_50;
  uint bundlePathLength;
  char *bundlePath;
  uint executablePathDirectoryLength;
  uint executablePathLength;
  char *executablePath;
  char *pcStack_30;
  uint systemDirLength_local;
  char *systemDir_local;
  char *pcStack_20;
  uint relPathLength_local;
  char *relPath_local;
  uint *pathLength_local;
  char **path_local;
  
  executablePath._4_4_ = systemDirLength;
  pcStack_30 = systemDir;
  systemDir_local._4_4_ = relPathLength;
  pcStack_20 = relPath;
  relPath_local = (char *)pathLength;
  pathLength_local = (uint *)path;
  uVar2 = checkStringOutParameter(path,pathLength);
  if (uVar2 != '\0') {
    _executablePathDirectoryLength = (char *)0x0;
    bundlePath._4_4_ = 0;
    getExecutablePath((char **)&executablePathDirectoryLength,(uint *)((long)&bundlePath + 4));
    bundlePath._0_4_ = 0;
    pcStack_50 = (char *)0x0;
    libraryPath._4_4_ = 0;
    getBundlePath(&stack0xffffffffffffffb0,(uint *)((long)&libraryPath + 4));
    _libraryPathDirectoryLength = (char *)0x0;
    maxLength = 0;
    getLibraryPath(symbol,(char **)&libraryPathDirectoryLength,&maxLength);
    local_68 = 0;
    getDirectoryPart(_libraryPathDirectoryLength,maxLength,&local_68);
    getDirectoryPart(_executablePathDirectoryLength,bundlePath._4_4_,(uint *)&bundlePath);
    __src = pcStack_50;
    if (local_68 < (uint)bundlePath) {
      local_d8 = (uint)bundlePath;
    }
    else {
      local_d8 = local_68;
    }
    if (libraryPath._4_4_ + 0x13 < local_d8) {
      local_dc = local_d8;
    }
    else {
      local_dc = libraryPath._4_4_ + 0x13;
    }
    lengths._4_8_ = _libraryPathDirectoryLength;
    subdir._4_4_ = local_68;
    local_90 = (uint)bundlePath;
    lengths[0] = libraryPath._4_4_;
    _resultdirLength = (char *)malloc((ulong)(systemDir_local._4_4_ + 9 + local_dc));
    uStack_a4 = 0;
    local_a8 = 0;
    for (dir._7_1_ = 0; uVar1 = lengths[0], dir._7_1_ < 3; dir._7_1_ = dir._7_1_ + 1) {
      pcStack_b8 = dirs[(ulong)dir._7_1_ - 1];
      systemBasePathLength = *(uint *)((long)&subdir + (ulong)dir._7_1_ * 4 + 4);
      if (systemBasePathLength != 0) {
        memcpy(_resultdirLength,pcStack_b8,(ulong)systemBasePathLength);
        for (local_bd = 0; local_bd < 3; local_bd = local_bd + 1) {
          local_be = local_bd * '\x03' + 1;
          uStack_a4 = systemBasePathLength;
          memcpy(_resultdirLength + systemBasePathLength,"/../../",(ulong)local_be);
          uStack_a4 = local_be + uStack_a4;
          memcpy(_resultdirLength + uStack_a4,pcStack_20,(ulong)systemDir_local._4_4_);
          local_a8 = uStack_a4;
          uStack_a4 = systemDir_local._4_4_ + uStack_a4;
          _resultdirLength[uStack_a4] = '\0';
          uVar2 = fileExists(_resultdirLength,uStack_a4);
          if (uVar2 != '\0') {
            copyToStringOutParameter
                      (_resultdirLength,local_a8,(char **)pathLength_local,(uint *)relPath_local);
            goto LAB_00105e6f;
          }
        }
        if ((executablePath._4_4_ != 0) &&
           (getSystemBasePath(pcStack_b8,systemBasePathLength + 1,(uint *)((long)&dir_1 + 4)),
           dir_1._4_4_ != 0)) {
          _resultdirLength[dir_1._4_4_] = '/';
          uStack_a4 = dir_1._4_4_ + 1;
          memcpy(_resultdirLength + uStack_a4,pcStack_30,(ulong)executablePath._4_4_);
          _resultdirLength[executablePath._4_4_ + uStack_a4] = '/';
          uStack_a4 = executablePath._4_4_ + uStack_a4 + 1;
          memcpy(_resultdirLength + uStack_a4,pcStack_20,(ulong)systemDir_local._4_4_);
          local_a8 = uStack_a4;
          uStack_a4 = systemDir_local._4_4_ + uStack_a4;
          _resultdirLength[uStack_a4] = '\0';
          uVar2 = fileExists(_resultdirLength,uStack_a4);
          if (uVar2 != '\0') {
            copyToStringOutParameter
                      (_resultdirLength,local_a8,(char **)pathLength_local,(uint *)relPath_local);
            goto LAB_00105e6f;
          }
        }
      }
    }
    memcpy(_resultdirLength,__src,(ulong)lengths[0]);
    builtin_strncpy(_resultdirLength + uVar1,"/Contents/Resources/",0x14);
    uStack_a4 = uVar1 + 0x14;
    memcpy(_resultdirLength + uStack_a4,pcStack_20,(ulong)systemDir_local._4_4_);
    local_a8 = uStack_a4;
    uStack_a4 = systemDir_local._4_4_ + uStack_a4;
    _resultdirLength[uStack_a4] = '\0';
    uVar2 = fileExists(_resultdirLength,uStack_a4);
    if (uVar2 == '\0') {
      invalidateStringOutParameter((char **)pathLength_local,(uint *)relPath_local);
    }
    else {
      copyToStringOutParameter
                (_resultdirLength,local_a8,(char **)pathLength_local,(uint *)relPath_local);
    }
LAB_00105e6f:
    free(_libraryPathDirectoryLength);
    free(_executablePathDirectoryLength);
    free(pcStack_50);
    free(_resultdirLength);
  }
  return;
}

Assistant:

void locatePath(char ** path, unsigned int * pathLength, const char * relPath, unsigned int relPathLength,
    const char * systemDir, unsigned int systemDirLength, void * symbol)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(path, pathLength))
    {
        return;
    }

    // Obtain executable path
    char * executablePath = 0x0;
    unsigned int executablePathLength = 0;
    getExecutablePath(&executablePath, &executablePathLength);
    unsigned int executablePathDirectoryLength = 0;

    // Obtain bundle path (in case of macOS)
    char * bundlePath = 0x0;
    unsigned int bundlePathLength = 0;
    getBundlePath(&bundlePath, &bundlePathLength);

    // Obtain library path
    char * libraryPath = 0x0;
    unsigned int libraryPathLength = 0;
    getLibraryPath(symbol, &libraryPath, &libraryPathLength);
    unsigned int libraryPathDirectoryLength = 0;

    // Extract directory parts of executable and library paths
    getDirectoryPart(libraryPath, libraryPathLength, &libraryPathDirectoryLength);
    getDirectoryPart(executablePath, executablePathLength, &executablePathDirectoryLength);

    // Compute the size of the maximal possible path to circumvent reallocation of output
    unsigned int maxLength = executablePathDirectoryLength;
    maxLength = maxLength > libraryPathDirectoryLength ? maxLength : libraryPathDirectoryLength;
    maxLength = maxLength > bundlePathLength + 19 ? maxLength : bundlePathLength + 19; // for "/Contents/Resources"
    maxLength += relPathLength + 7 + 2; // for the extra upward path checks, the extra path delimiter and null byte suffix

    const char * dirs[] = { libraryPath, executablePath, bundlePath };
    const unsigned int lengths[] = { libraryPathDirectoryLength, executablePathDirectoryLength, bundlePathLength };

    char * subdir = (char *)malloc(sizeof(char) * maxLength);
    unsigned int subdirLength = 0;
    unsigned int resultdirLength = 0;

    // Check libraryPath, executablePath, and bundlePath as base directories
    for (unsigned char i = 0; i < 3; ++i)
    {
        // Obtain current base directory and associated length
        const char * dir = dirs[i];
        const unsigned int length = lengths[i];

        // Early out for missing base directory
        if (length <= 0)
        {
            continue;
        }

        // Initialize directory to test with base directory
        memcpy(subdir, dir, length);

        // Check <basedir>/<relpath>, <basedir>/../<relpath>, and <basedir>/../../<relpath>
        for (unsigned char j = 0; j < 3; ++j)
        {
            unsigned char relDirLength = j * 3 + 1;

            subdirLength = length;
            // Copy either '/', '/../', or '/../../', depending on current iteration
            memcpy(subdir+subdirLength, "/../../", relDirLength);
            subdirLength += relDirLength;
            memcpy(subdir+subdirLength, relPath, relPathLength);
            resultdirLength = subdirLength;
            subdirLength += relPathLength;

            // End subdirectory with null byte for system functions
            subdir[subdirLength] = 0;

            if (fileExists(subdir, subdirLength)) // successfully found directory
            {
                copyToStringOutParameter(subdir, resultdirLength, path, pathLength);

                goto out;
            }
        }

        if (systemDirLength <= 0)
            continue;

        // Check if it is a system path
        // length + 1 points to the '/' of the directory part of the path

        unsigned int systemBasePathLength;
        getSystemBasePath(dir, length + 1, &systemBasePathLength);

        if (systemBasePathLength > 0)
        {
            subdirLength = systemBasePathLength;
            memcpy(subdir+subdirLength, "/", 1);
            subdirLength += 1;
            memcpy(subdir+subdirLength, systemDir, systemDirLength);
            subdirLength += systemDirLength;
            memcpy(subdir+subdirLength, "/", 1);
            subdirLength += 1;
            memcpy(subdir+subdirLength, relPath, relPathLength);
            resultdirLength = subdirLength;
            subdirLength += relPathLength;

            // End subdirectory with null byte for system functions
            subdir[subdirLength] = 0;

            if (fileExists(subdir, subdirLength)) // successfully found directory
            {
                copyToStringOutParameter(subdir, resultdirLength, path, pathLength);

                goto out;
            }
        }
    }

    // Check app bundle resources
    {
        // Obtain current base directory and associated length
        const char * dir = dirs[2];
        const unsigned int length = lengths[2];

        // Initialize directory to test with base directory
        memcpy(subdir, dir, length);

        subdirLength = length;
        memcpy(subdir+subdirLength, "/Contents/Resources/", 20);
        subdirLength += 20;
        memcpy(subdir+subdirLength, relPath, relPathLength);
        resultdirLength = subdirLength;
        subdirLength += relPathLength;

        // End subdirectory with null byte for system functions
        subdir[subdirLength] = 0;

        if (fileExists(subdir, subdirLength)) // successfully found directory
        {
            copyToStringOutParameter(subdir, resultdirLength, path, pathLength);

            goto out;
        }
    }

    // Could not find path
    invalidateStringOutParameter(path, pathLength);

out:
    // Free temporary memory
    free(libraryPath);
    free(executablePath);
    free(bundlePath);
    free(subdir);
}